

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

void __thiscall gvr::Mesh::loadPLY(Mesh *this,PLYReader *ply)

{
  bool bVar1;
  bool bVar2;
  ply_type pVar3;
  long lVar4;
  ulong uVar5;
  string *in_RSI;
  Mesh *in_RDI;
  TriangleReceiver tr;
  int tn;
  FloatArrayReceiver nz;
  FloatArrayReceiver ny;
  FloatArrayReceiver nx;
  FloatArrayReceiver sz;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver sc;
  FloatArrayReceiver se;
  FloatArrayReceiver ss;
  FloatArrayReceiver vz;
  FloatArrayReceiver vy;
  FloatArrayReceiver vx;
  int vn;
  undefined4 in_stack_fffffffffffff3f8;
  uint uVar6;
  undefined4 in_stack_fffffffffffff3fc;
  Mesh *in_stack_fffffffffffff400;
  PLYReader *in_stack_fffffffffffff408;
  PLYReader *in_stack_fffffffffffff410;
  allocator *paVar7;
  undefined4 in_stack_fffffffffffff418;
  undefined4 in_stack_fffffffffffff41c;
  bool local_bc5;
  Mesh *this_00;
  bool local_9e5;
  PLYReader *in_stack_fffffffffffff638;
  undefined4 in_stack_fffffffffffff640;
  undefined4 in_stack_fffffffffffff644;
  bool local_97d;
  undefined1 local_931 [38];
  byte local_90b;
  byte local_90a;
  allocator local_909;
  string local_908 [37];
  byte local_8e3;
  byte local_8e2;
  allocator local_8e1;
  string local_8e0 [37];
  byte local_8bb;
  byte local_8ba;
  allocator local_8b9;
  string local_8b8 [39];
  allocator local_891;
  string local_890 [39];
  undefined1 local_869 [40];
  allocator local_841;
  string local_840 [39];
  allocator local_819;
  string local_818 [39];
  allocator local_7f1;
  string local_7f0 [39];
  allocator local_7c9;
  string local_7c8 [55];
  allocator local_791;
  string local_790 [32];
  undefined4 local_770;
  allocator local_769;
  string local_768 [39];
  allocator local_741;
  string local_740 [39];
  allocator local_719;
  string local_718 [39];
  allocator local_6f1;
  string local_6f0 [39];
  allocator local_6c9;
  string local_6c8 [39];
  allocator local_6a1;
  string local_6a0 [135];
  allocator local_619;
  string local_618 [39];
  allocator local_5f1;
  string local_5f0 [39];
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [39];
  allocator local_579;
  string local_578 [39];
  allocator local_551;
  string local_550 [135];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [135];
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [133];
  byte local_22b;
  byte local_22a;
  allocator local_229;
  string local_228 [37];
  byte local_203;
  byte local_202;
  allocator local_201;
  string local_200 [37];
  byte local_1db;
  byte local_1da;
  allocator local_1d9;
  string local_1d8 [37];
  byte local_1b3;
  byte local_1b2;
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [37];
  byte local_13b;
  byte local_13a;
  allocator local_139;
  string local_138 [37];
  byte local_113;
  byte local_112;
  allocator local_111;
  string local_110 [37];
  byte local_eb;
  byte local_ea;
  allocator local_e9;
  string local_e8 [37];
  byte local_c3;
  byte local_c2;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  uint local_14;
  string *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"vertex",&local_39);
  lVar4 = PLYReader::instancesOfElement
                    (in_stack_fffffffffffff408,(string *)in_stack_fffffffffffff400);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_14 = (uint)lVar4;
  Model::setOriginFromPLY
            ((Model *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             in_stack_fffffffffffff638);
  uVar6 = local_14;
  std::allocator<char>::allocator();
  local_c2 = 0;
  local_c3 = 0;
  local_ea = 0;
  local_eb = 0;
  local_112 = 0;
  local_113 = 0;
  local_13a = 0;
  local_13b = 0;
  std::__cxx11::string::string(local_70,"vertex",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"scan_size",&local_99);
  pVar3 = PLYReader::getTypeOfProperty
                    ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                     &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename);
  local_97d = true;
  if (pVar3 == ply_none) {
    std::allocator<char>::allocator();
    local_c2 = 1;
    std::__cxx11::string::string(local_c0,"vertex",&local_c1);
    local_c3 = 1;
    std::allocator<char>::allocator();
    local_ea = 1;
    std::__cxx11::string::string(local_e8,"scan_error",&local_e9);
    local_eb = 1;
    pVar3 = PLYReader::getTypeOfProperty
                      ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                       &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename);
    local_97d = true;
    if (pVar3 == ply_none) {
      std::allocator<char>::allocator();
      local_112 = 1;
      std::__cxx11::string::string(local_110,"vertex",&local_111);
      local_113 = 1;
      std::allocator<char>::allocator();
      local_13a = 1;
      std::__cxx11::string::string(local_138,"scan_conf",&local_139);
      local_13b = 1;
      pVar3 = PLYReader::getTypeOfProperty
                        ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                         &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename);
      local_97d = pVar3 != ply_none;
    }
  }
  paVar7 = &local_161;
  std::allocator<char>::allocator();
  local_1b2 = 0;
  local_1b3 = 0;
  local_1da = 0;
  local_1db = 0;
  local_202 = 0;
  local_203 = 0;
  local_22a = 0;
  local_22b = 0;
  std::__cxx11::string::string(local_160,"vertex",paVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"sx",&local_189);
  pVar3 = PLYReader::getTypeOfProperty
                    ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                     &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename);
  local_9e5 = false;
  if (pVar3 != ply_none) {
    std::allocator<char>::allocator();
    local_1b2 = 1;
    std::__cxx11::string::string(local_1b0,"vertex",&local_1b1);
    local_1b3 = 1;
    std::allocator<char>::allocator();
    local_1da = 1;
    std::__cxx11::string::string(local_1d8,"sy",&local_1d9);
    local_1db = 1;
    pVar3 = PLYReader::getTypeOfProperty
                      ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                       &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename);
    local_9e5 = false;
    if (pVar3 != ply_none) {
      std::allocator<char>::allocator();
      local_202 = 1;
      std::__cxx11::string::string(local_200,"vertex",&local_201);
      local_203 = 1;
      std::allocator<char>::allocator();
      local_22a = 1;
      std::__cxx11::string::string(local_228,"sz",&local_229);
      local_22b = 1;
      pVar3 = PLYReader::getTypeOfProperty
                        ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                         &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename);
      local_9e5 = pVar3 != ply_none;
    }
  }
  (*(in_RDI->super_PointCloud).super_Model._vptr_Model[9])
            (in_RDI,(ulong)uVar6,(ulong)local_97d,(ulong)local_9e5);
  if ((local_22b & 1) != 0) {
    std::__cxx11::string::~string(local_228);
  }
  if ((local_22a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
  }
  if ((local_203 & 1) != 0) {
    std::__cxx11::string::~string(local_200);
  }
  if ((local_202 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
  }
  if ((local_1db & 1) != 0) {
    std::__cxx11::string::~string(local_1d8);
  }
  if ((local_1da & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  if ((local_1b3 & 1) != 0) {
    std::__cxx11::string::~string(local_1b0);
  }
  if ((local_1b2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  if ((local_13b & 1) != 0) {
    std::__cxx11::string::~string(local_138);
  }
  if ((local_13a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  if ((local_113 & 1) != 0) {
    std::__cxx11::string::~string(local_110);
  }
  if ((local_112 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  if ((local_eb & 1) != 0) {
    std::__cxx11::string::~string(local_e8);
  }
  if ((local_ea & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  if ((local_c3 & 1) != 0) {
    std::__cxx11::string::~string(local_c0);
  }
  if ((local_c2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  PointCloud::getVertexArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff410,(float *)in_stack_fffffffffffff408,
             (size_t)in_stack_fffffffffffff400,
             CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  PointCloud::getVertexArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff410,(float *)in_stack_fffffffffffff408,
             (size_t)in_stack_fffffffffffff400,
             CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  PointCloud::getVertexArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff410,(float *)in_stack_fffffffffffff408,
             (size_t)in_stack_fffffffffffff400,
             CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"vertex",&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"x",&local_2d9);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
             (PLYReceiver *)in_stack_fffffffffffff400);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"vertex",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"y",&local_329);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
             (PLYReceiver *)in_stack_fffffffffffff400);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"vertex",&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"z",&local_379);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
             (PLYReceiver *)in_stack_fffffffffffff400);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  PointCloud::getScanPropArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff410,(float *)in_stack_fffffffffffff408,
             (size_t)in_stack_fffffffffffff400,
             CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  PointCloud::getScanPropArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff410,(float *)in_stack_fffffffffffff408,
             (size_t)in_stack_fffffffffffff400,
             CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  PointCloud::getScanPropArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff410,(float *)in_stack_fffffffffffff408,
             (size_t)in_stack_fffffffffffff400,
             CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  bVar2 = PointCloud::hasScanProp(&in_RDI->super_PointCloud);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_400,"vertex",&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_428,"scan_size",&local_429);
    PLYReader::setReceiver
              ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
               &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
               (PLYReceiver *)in_stack_fffffffffffff400);
    std::__cxx11::string::~string(local_428);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_450,"vertex",&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_478,"scan_error",&local_479);
    PLYReader::setReceiver
              ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
               &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
               (PLYReceiver *)in_stack_fffffffffffff400);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,"vertex",&local_4a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,"scan_conf",&local_4c9);
    PLYReader::setReceiver
              ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
               &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
               (PLYReceiver *)in_stack_fffffffffffff400);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  }
  PointCloud::getScanPosArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff410,(float *)in_stack_fffffffffffff408,
             (size_t)in_stack_fffffffffffff400,
             CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  PointCloud::getScanPosArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff410,(float *)in_stack_fffffffffffff408,
             (size_t)in_stack_fffffffffffff400,
             CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  PointCloud::getScanPosArray(&in_RDI->super_PointCloud);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff410,(float *)in_stack_fffffffffffff408,
             (size_t)in_stack_fffffffffffff400,
             CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  bVar2 = PointCloud::hasScanPos(&in_RDI->super_PointCloud);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"vertex",&local_551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_578,"sx",&local_579);
    PLYReader::setReceiver
              ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
               &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
               (PLYReceiver *)in_stack_fffffffffffff400);
    std::__cxx11::string::~string(local_578);
    std::allocator<char>::~allocator((allocator<char> *)&local_579);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5a0,"vertex",&local_5a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5c8,"sy",&local_5c9);
    PLYReader::setReceiver
              ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
               &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
               (PLYReceiver *)in_stack_fffffffffffff400);
    std::__cxx11::string::~string(local_5c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
    std::__cxx11::string::~string(local_5a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5f0,"vertex",&local_5f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_618,"sz",&local_619);
    PLYReader::setReceiver
              ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
               &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
               (PLYReceiver *)in_stack_fffffffffffff400);
    std::__cxx11::string::~string(local_618);
    std::allocator<char>::~allocator((allocator<char> *)&local_619);
    std::__cxx11::string::~string(local_5f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  }
  getNormalArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff410,(float *)in_stack_fffffffffffff408,
             (size_t)in_stack_fffffffffffff400,
             CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  getNormalArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff410,(float *)in_stack_fffffffffffff408,
             (size_t)in_stack_fffffffffffff400,
             CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  getNormalArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff410,(float *)in_stack_fffffffffffff408,
             (size_t)in_stack_fffffffffffff400,
             CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a0,"vertex",&local_6a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c8,"nx",&local_6c9);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
             (PLYReceiver *)in_stack_fffffffffffff400);
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  std::__cxx11::string::~string(local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f0,"vertex",&local_6f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_718,"ny",&local_719);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
             (PLYReceiver *)in_stack_fffffffffffff400);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::__cxx11::string::~string(local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"vertex",&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_768,"nz",&local_769);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
             (PLYReceiver *)in_stack_fffffffffffff400);
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_790,"face",&local_791);
  uVar5 = PLYReader::instancesOfElement
                    (in_stack_fffffffffffff408,(string *)in_stack_fffffffffffff400);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  local_770 = (int)uVar5;
  (*(in_RDI->super_PointCloud).super_Model._vptr_Model[10])(in_RDI,uVar5 & 0xffffffff);
  TriangleReceiver::TriangleReceiver
            ((TriangleReceiver *)in_stack_fffffffffffff400,
             (Mesh *)CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c8,"face",&local_7c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f0,"vertex_index",&local_7f1);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
             (PLYReceiver *)in_stack_fffffffffffff400);
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
  std::__cxx11::string::~string(local_7c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_818,"face",&local_819);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"vertex_indices",&local_841);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename,
             (PLYReceiver *)in_stack_fffffffffffff400);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  PLYReader::readData(in_stack_fffffffffffff410);
  this_00 = (Mesh *)local_869;
  std::allocator<char>::allocator();
  local_8ba = 0;
  local_8bb = 0;
  local_8e2 = 0;
  local_8e3 = 0;
  local_90a = 0;
  local_90b = 0;
  bVar1 = false;
  bVar2 = false;
  std::__cxx11::string::string((string *)(local_869 + 1),"vertex",(allocator *)this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_890,"nx",&local_891);
  pVar3 = PLYReader::getTypeOfProperty
                    ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                     &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename);
  local_bc5 = true;
  if (pVar3 != ply_none) {
    std::allocator<char>::allocator();
    local_8ba = 1;
    std::__cxx11::string::string(local_8b8,"vertex",&local_8b9);
    local_8bb = 1;
    std::allocator<char>::allocator();
    local_8e2 = 1;
    std::__cxx11::string::string(local_8e0,"ny",&local_8e1);
    local_8e3 = 1;
    pVar3 = PLYReader::getTypeOfProperty
                      ((PLYReader *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                       &in_stack_fffffffffffff410->filename,&in_stack_fffffffffffff408->filename);
    local_bc5 = true;
    if (pVar3 != ply_none) {
      paVar7 = &local_909;
      std::allocator<char>::allocator();
      local_90a = 1;
      std::__cxx11::string::string(local_908,"vertex",paVar7);
      local_90b = 1;
      in_stack_fffffffffffff400 = (Mesh *)local_931;
      std::allocator<char>::allocator();
      bVar1 = true;
      std::__cxx11::string::string
                ((string *)(local_931 + 1),"nz",(allocator *)in_stack_fffffffffffff400);
      bVar2 = true;
      pVar3 = PLYReader::getTypeOfProperty
                        ((PLYReader *)CONCAT44(pVar3,in_stack_fffffffffffff418),(string *)paVar7,
                         local_10);
      local_bc5 = pVar3 == ply_none;
    }
  }
  uVar6 = (uint)local_bc5 << 0x18;
  if (bVar2) {
    std::__cxx11::string::~string((string *)(local_931 + 1));
  }
  if (bVar1) {
    std::allocator<char>::~allocator((allocator<char> *)local_931);
  }
  if ((local_90b & 1) != 0) {
    std::__cxx11::string::~string(local_908);
  }
  if ((local_90a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_909);
  }
  if ((local_8e3 & 1) != 0) {
    std::__cxx11::string::~string(local_8e0);
  }
  if ((local_8e2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
  }
  if ((local_8bb & 1) != 0) {
    std::__cxx11::string::~string(local_8b8);
  }
  if ((local_8ba & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
  }
  std::__cxx11::string::~string(local_890);
  std::allocator<char>::~allocator((allocator<char> *)&local_891);
  std::__cxx11::string::~string((string *)(local_869 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_869);
  if ((uVar6 & 0x1000000) == 0) {
    normalizeNormals(in_stack_fffffffffffff400);
  }
  else {
    recalculateNormals(this_00);
  }
  return;
}

Assistant:

void Mesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}